

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionDAGChecker.cxx
# Opt level: O1

void __thiscall cmGeneratorExpressionDAGChecker::Initialize(cmGeneratorExpressionDAGChecker *this)

{
  cmGeneratorTarget **__k;
  _Rb_tree_header *p_Var1;
  cmGeneratorExpressionDAGChecker *pcVar2;
  bool bVar3;
  Result RVar4;
  cmGeneratorExpressionDAGChecker *this_00;
  const_iterator cVar5;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *this_01;
  _Base_ptr p_Var6;
  _Base_ptr p_Var7;
  
  pcVar2 = this;
  do {
    this_00 = pcVar2;
    pcVar2 = this_00->Parent;
  } while (this_00->Parent != (cmGeneratorExpressionDAGChecker *)0x0);
  RVar4 = CheckGraph(this);
  this->CheckResult = RVar4;
  if ((RVar4 == DAG) &&
     ((((((bVar3 = EvaluatingIncludeDirectories(this_00), bVar3 ||
          (bVar3 = EvaluatingSystemIncludeDirectories(this_00), bVar3)) ||
         (bVar3 = EvaluatingCompileDefinitions(this_00), bVar3)) ||
        ((bVar3 = EvaluatingCompileOptions(this_00), bVar3 ||
         (bVar3 = EvaluatingAutoUicOptions(this_00), bVar3)))) ||
       ((bVar3 = EvaluatingSources(this_00), bVar3 ||
        ((bVar3 = EvaluatingCompileFeatures(this_00), bVar3 ||
         (bVar3 = EvaluatingLinkOptions(this_00), bVar3)))))) ||
      ((bVar3 = EvaluatingLinkDirectories(this_00), bVar3 ||
       (bVar3 = EvaluatingLinkDepends(this_00), bVar3)))))) {
    __k = &this->Target;
    p_Var7 = (this_00->Seen)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var1 = &(this_00->Seen)._M_t._M_impl.super__Rb_tree_header;
    p_Var6 = &p_Var1->_M_header;
    if (p_Var7 != (_Base_ptr)0x0) {
      do {
        if (*(cmGeneratorTarget **)(p_Var7 + 1) >= *__k) {
          p_Var6 = p_Var7;
        }
        p_Var7 = (&p_Var7->_M_left)[*(cmGeneratorTarget **)(p_Var7 + 1) < *__k];
      } while (p_Var7 != (_Base_ptr)0x0);
    }
    p_Var7 = &p_Var1->_M_header;
    if (((_Rb_tree_header *)p_Var6 != p_Var1) &&
       (p_Var7 = p_Var6, *__k < *(cmGeneratorTarget **)(p_Var6 + 1))) {
      p_Var7 = &p_Var1->_M_header;
    }
    if (((_Rb_tree_header *)p_Var7 == p_Var1) ||
       (cVar5 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&p_Var7[1]._M_parent,&this->Property),
       cVar5._M_node == (_Base_ptr)&p_Var7[1]._M_left)) {
      this_01 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                 *)std::
                   map<const_cmGeneratorTarget_*,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                   ::operator[](&this_00->Seen,__k);
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>(this_01,&this->Property);
      return;
    }
    this->CheckResult = ALREADY_SEEN;
  }
  return;
}

Assistant:

void cmGeneratorExpressionDAGChecker::Initialize()
{
  const cmGeneratorExpressionDAGChecker* top = this;
  const cmGeneratorExpressionDAGChecker* p = this->Parent;
  while (p) {
    top = p;
    p = p->Parent;
  }
  this->CheckResult = this->CheckGraph();

#define TEST_TRANSITIVE_PROPERTY_METHOD(METHOD) top->METHOD() ||

  if (CheckResult == DAG &&
      (CM_FOR_EACH_TRANSITIVE_PROPERTY_METHOD(
        TEST_TRANSITIVE_PROPERTY_METHOD) false)) // NOLINT(*)
#undef TEST_TRANSITIVE_PROPERTY_METHOD
  {
    std::map<cmGeneratorTarget const*, std::set<std::string>>::const_iterator
      it = top->Seen.find(this->Target);
    if (it != top->Seen.end()) {
      const std::set<std::string>& propSet = it->second;
      if (propSet.find(this->Property) != propSet.end()) {
        this->CheckResult = ALREADY_SEEN;
        return;
      }
    }
    const_cast<cmGeneratorExpressionDAGChecker*>(top)
      ->Seen[this->Target]
      .insert(this->Property);
  }
}